

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptpubkey_multisig_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t threshold,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong __nmemb;
  ulong uVar6;
  uchar *puVar7;
  uchar *__dest;
  bool bVar8;
  uchar pubkey_bytes [495];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = bytes_len;
  __nmemb = SUB168(auVar1 / ZEXT816(0x21),0);
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar5 = -2;
  if (((bytes_len != 0 && bytes != (uchar *)0x0) &&
      (threshold <= __nmemb &&
       ((0xfffffff0 < threshold - 0x10 && 0xfffffffffffffe10 < bytes_len - 0x210) &&
       bytes_len % 0x21 == 0))) &&
     ((bytes_out != (uchar *)0x0 && (flags & 0xfffffff7) == 0) && written != (size_t *)0x0)) {
    uVar6 = __nmemb * 0x22 + 3;
    if (uVar6 <= len) {
      __dest = pubkey_bytes;
      memcpy(__dest,bytes,bytes_len);
      if (flags != 0) {
        qsort(pubkey_bytes,__nmemb,0x21,pubkey_compare);
      }
      *bytes_out = (byte)threshold | 0x50;
      puVar7 = bytes_out + 2;
      while (bVar8 = __nmemb != 0, __nmemb = __nmemb - 1, bVar8) {
        puVar7[-1] = '!';
        uVar2 = *(undefined8 *)(__dest + 8);
        uVar3 = *(undefined8 *)(__dest + 0x10);
        uVar4 = *(undefined8 *)(__dest + 0x18);
        *(undefined8 *)puVar7 = *(undefined8 *)__dest;
        *(undefined8 *)(puVar7 + 8) = uVar2;
        *(undefined8 *)(puVar7 + 0x10) = uVar3;
        *(undefined8 *)(puVar7 + 0x18) = uVar4;
        puVar7[0x20] = __dest[0x20];
        puVar7 = puVar7 + 0x22;
        __dest = __dest + 0x21;
      }
      wally_clear(pubkey_bytes,0x1ef);
      puVar7[-1] = SUB161(auVar1 / ZEXT816(0x21),0) + 'P';
      *puVar7 = 0xae;
    }
    *written = uVar6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int wally_scriptpubkey_multisig_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t threshold,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t n_pubkeys = bytes_len / EC_PUBLIC_KEY_LEN;
    size_t script_len = 3 + (n_pubkeys * (EC_PUBLIC_KEY_LEN + 1));
    size_t i;
    unsigned char pubkey_bytes[15 * EC_PUBLIC_KEY_LEN];

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || bytes_len % EC_PUBLIC_KEY_LEN ||
        n_pubkeys < 1 || n_pubkeys > 15 || threshold < 1 || threshold > 15 ||
        threshold > n_pubkeys || (flags & ~WALLY_SCRIPT_MULTISIG_SORTED) ||
        !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    memcpy(pubkey_bytes, bytes, bytes_len);
    if (flags & WALLY_SCRIPT_MULTISIG_SORTED) {
        qsort(pubkey_bytes, n_pubkeys, EC_PUBLIC_KEY_LEN, pubkey_compare);
    }

    *bytes_out++ = v_to_op_n(threshold);
    for (i = 0; i < n_pubkeys; ++i) {
        *bytes_out++ = EC_PUBLIC_KEY_LEN;
        memcpy(bytes_out, pubkey_bytes + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
        bytes_out += EC_PUBLIC_KEY_LEN;
    }
    wally_clear(pubkey_bytes, sizeof(pubkey_bytes));
    *bytes_out++ = v_to_op_n(n_pubkeys);
    *bytes_out = OP_CHECKMULTISIG;
    *written = script_len;
    return WALLY_OK;
}